

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

int __thiscall luna::Lexer::GetToken(Lexer *this,TokenDetail *detail)

{
  String *pSVar1;
  int iVar2;
  int iVar3;
  LexException *this_00;
  anon_union_16_2_eed97686_for_String_2 *module;
  int token;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (detail == (TokenDetail *)0x0) {
    __assert_fail("detail",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp",
                  0x55,"int luna::Lexer::GetToken(TokenDetail *)");
  }
  (detail->field_0).number_ = 0.0;
  detail->token_ = 0x11e;
  iVar2 = this->column_;
  detail->line_ = this->line_;
  detail->column_ = iVar2;
  detail->module_ = this->module_;
  if (this->current_ == -1) {
    iVar2 = Next(this);
    this->current_ = iVar2;
  }
LAB_0014b667:
  iVar2 = this->current_;
  if (0x7a < iVar2) {
    if ((iVar2 == 0x7b) || (iVar2 == 0x7d)) {
switchD_0014b689_caseD_23:
      iVar3 = Next(this);
LAB_0014b753:
      this->current_ = iVar3;
      detail->token_ = iVar2;
      iVar3 = this->column_;
      detail->line_ = this->line_;
      detail->column_ = iVar3;
      detail->module_ = this->module_;
    }
    else {
      if (iVar2 != 0x7e) {
switchD_0014b689_caseD_e:
        iVar2 = LexId(this,detail);
        return iVar2;
      }
      iVar2 = Next(this);
      if (iVar2 != 0x3d) {
        this_00 = (LexException *)__cxa_allocate_exception(0x20);
        pSVar1 = this->module_;
        if ((pSVar1->super_GCObject).field_0x11 == '\0') {
          module = &pSVar1->field_1;
        }
        else {
          module = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
        }
        LexException::LexException<char_const(&)[21]>
                  (this_00,module->str_buffer_,this->line_,this->column_,
                   (char (*) [21])"expect \'=\' after \'~\'");
        __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
      }
      iVar2 = Next(this);
      this->current_ = iVar2;
      detail->token_ = 0x119;
      iVar2 = this->column_;
      detail->line_ = this->line_;
      detail->column_ = iVar2;
      detail->module_ = this->module_;
      iVar2 = 0x119;
    }
    return iVar2;
  }
  switch(iVar2) {
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    iVar2 = Next(this);
    this->current_ = iVar2;
    goto LAB_0014b667;
  case 10:
  case 0xd:
    LexNewLine(this);
    goto LAB_0014b667;
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x24:
  case 0x26:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5c:
    goto switchD_0014b689_caseD_e;
  case 0x22:
  case 0x27:
    LexSingleLineString(this,detail);
    return 0x116;
  case 0x23:
  case 0x25:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x5d:
  case 0x5e:
    goto switchD_0014b689_caseD_23;
  case 0x2d:
    goto switchD_0014b689_caseD_2d;
  case 0x2e:
    iVar2 = Next(this);
    if (iVar2 != 0x2e) {
      if (9 < iVar2 - 0x30U) {
        this->current_ = iVar2;
        detail->token_ = 0x2e;
        iVar2 = this->column_;
        detail->line_ = this->line_;
        detail->column_ = iVar2;
        detail->module_ = this->module_;
        return 0x2e;
      }
      (this->token_buffer_)._M_string_length = 0;
      *(this->token_buffer_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::push_back((char)this + '@');
      this->current_ = iVar2;
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      local_30 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:146:53)>
                 ::_M_invoke;
      local_38 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:146:53)>
                 ::_M_manager;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_50 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:147:53)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:147:53)>
                 ::_M_manager;
      LexNumberXFractional
                (this,detail,false,true,(function<bool_(int)> *)&local_48,
                 (function<bool_(int)> *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      if (local_38 == (code *)0x0) {
        return 0x117;
      }
      (*local_38)(&local_48,&local_48,__destroy_functor);
      return 0x117;
    }
    iVar3 = Next(this);
    if (iVar3 == 0x2e) {
      iVar3 = Next(this);
      iVar2 = 0x11d;
    }
    else {
      iVar2 = 0x11c;
    }
    goto LAB_0014b753;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    LexNumber(this,detail);
    return 0x117;
  case 0x3c:
    iVar2 = 0x11a;
    break;
  case 0x3d:
    iVar2 = 0x118;
    break;
  case 0x3e:
    iVar2 = 0x11b;
    break;
  case 0x5b:
    iVar2 = Next(this);
    this->current_ = iVar2;
    if ((iVar2 != 0x5b) && (iVar2 != 0x3d)) {
      detail->token_ = 0x5b;
      iVar2 = this->column_;
      detail->line_ = this->line_;
      detail->column_ = iVar2;
      detail->module_ = this->module_;
      return 0x5b;
    }
    LexMultiLineString(this,detail);
    return 0x116;
  default:
    if (iVar2 == -1) {
      return 0x11e;
    }
    goto switchD_0014b689_caseD_e;
  }
  iVar2 = LexXEqual(this,detail,iVar2);
  return iVar2;
switchD_0014b689_caseD_2d:
  iVar2 = Next(this);
  if (iVar2 != 0x2d) {
    this->current_ = iVar2;
    detail->token_ = 0x2d;
    iVar2 = this->column_;
    detail->line_ = this->line_;
    detail->column_ = iVar2;
    detail->module_ = this->module_;
    return 0x2d;
  }
  LexComment(this);
  goto LAB_0014b667;
}

Assistant:

int Lexer::GetToken(TokenDetail *detail)
    {
        assert(detail);
        SET_EOF_TOKEN_DETAIL(detail);
        if (current_ == EOF)
            current_ = Next();

        while (current_ != EOF)
        {
            switch (current_) {
            case ' ': case '\t': case '\v': case '\f':
                current_ = Next();
                break;
            case '\r': case '\n':
                LexNewLine();
                break;
            case '-':
                {
                    int next = Next();
                    if (next == '-')
                        LexComment();
                    else
                    {
                        current_ = next;
                        RETURN_NORMAL_TOKEN_DETAIL(detail, '-');
                    }
                }
                break;
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9':
                return LexNumber(detail);
            case '+': case '*': case '/': case '%': case '^':
            case '#': case '(': case ')': case '{': case '}':
            case ']': case ';': case ':': case ',':
                {
                    int token = current_;
                    current_ = Next();
                    RETURN_NORMAL_TOKEN_DETAIL(detail, token);
                }
                break;
            case '.':
                {
                    int next = Next();
                    if (next == '.')
                    {
                        int pre_next = Next();
                        if (pre_next == '.')
                        {
                            current_ = Next();
                            RETURN_NORMAL_TOKEN_DETAIL(detail, Token_VarArg);
                        }
                        else
                        {
                            current_ = pre_next;
                            RETURN_NORMAL_TOKEN_DETAIL(detail, Token_Concat);
                        }
                    }
                    else if (isdigit(next))
                    {
                        token_buffer_.clear();
                        token_buffer_.push_back(current_);
                        current_ = next;
                        return LexNumberXFractional(detail, false, true,
                                                    [](int c) { return isdigit(c) != 0; },
                                                    [](int c) { return c == 'e' || c == 'E'; });
                    }
                    else
                    {
                        current_ = next;
                        RETURN_NORMAL_TOKEN_DETAIL(detail, '.');
                    }
                }
                break;
            case '~':
                {
                    int next = Next();
                    if (next != '=')
                        throw LexException(module_->GetCStr(),
                                line_, column_, "expect '=' after '~'");
                    current_ = Next();
                    RETURN_NORMAL_TOKEN_DETAIL(detail, Token_NotEqual);
                }
                break;
            case '=':
                return LexXEqual(detail, Token_Equal);
            case '>':
                return LexXEqual(detail, Token_GreaterEqual);
            case '<':
                return LexXEqual(detail, Token_LessEqual);
            case '[':
                {
                    current_ = Next();
                    if (current_ == '[' || current_ == '=')
                        return LexMultiLineString(detail);
                    else
                        RETURN_NORMAL_TOKEN_DETAIL(detail, '[');
                }
                break;
            case '\'': case '"':
                return LexSingleLineString(detail);
            default:
                return LexId(detail);
            }
        }

        return Token_EOF;
    }